

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_805dd3::processLinkDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *directories,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueDirectories,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugDirectories,string *language)

{
  TargetPropertyEntry *pTVar1;
  MessageType t;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  reference ppTVar5;
  cmLocalGenerator *pcVar6;
  undefined4 extraout_var;
  reference in_name;
  ostream *poVar7;
  ulong uVar8;
  cmake *this;
  string *psVar9;
  PolicyID id;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  cmListFileBacktrace local_398;
  allocator<char> local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2c0;
  undefined1 local_2b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b0;
  undefined1 local_2a8;
  int local_29c;
  string local_298;
  string local_278;
  MessageType local_258;
  byte local_251;
  MessageType messageType;
  bool noMessage;
  ostringstream e;
  string *entryDirectory;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string usedDirectories;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryDirectories;
  string *targetName;
  cmLinkImplItem *item;
  TargetPropertyEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *__range1;
  bool debugDirectories_local;
  string *config_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueDirectories_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *directories_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *entries_local;
  cmGeneratorTarget *tgt_local;
  
  __end1 = std::
           vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
           ::begin(entries);
  entry = (TargetPropertyEntry *)
          std::
          vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
          ::end(entries);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
                                *)&entry);
    if (!bVar2) {
      return;
    }
    ppTVar5 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&__end1);
    pTVar1 = *ppTVar5;
    entryDirectories.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         cmLinkItem::AsStr_abi_cxx11_(&pTVar1->LinkImplItem->super_cmLinkItem);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
    iVar3 = (*pTVar1->_vptr_TargetPropertyEntry[3])(pTVar1,pcVar6,config,0,tgt,dagChecker,language);
    cmSystemTools::ExpandListArgument
              ((string *)CONCAT44(extraout_var,iVar3),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,false);
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88);
    entryDirectory =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&entryDirectory), bVar2) {
      in_name = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType);
        local_251 = 0;
        local_258 = FATAL_ERROR;
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          poVar7 = std::operator<<((ostream *)&messageType,"Target \"");
          poVar7 = std::operator<<(poVar7,(string *)
                                          entryDirectories.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar7 = std::operator<<(poVar7,
                                   "\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                                  );
          poVar7 = std::operator<<(poVar7,(string *)in_name);
          std::operator<<(poVar7,"\"");
        }
        else {
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0081(tgt);
          if (PVar4 == OLD) {
            local_251 = 1;
          }
          else if (PVar4 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_278,(cmPolicies *)0x51,id);
            poVar7 = std::operator<<((ostream *)&messageType,(string *)&local_278);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)&local_278);
            local_258 = AUTHOR_WARNING;
          }
          poVar7 = std::operator<<((ostream *)&messageType,
                                   "Found relative path while evaluating link directories of \"");
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar7 = std::operator<<(poVar7,(string *)psVar9);
          poVar7 = std::operator<<(poVar7,"\":\n  \"");
          poVar7 = std::operator<<(poVar7,(string *)in_name);
          std::operator<<(poVar7,"\"\n");
        }
        if ((local_251 & 1) == 0) {
          pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
          t = local_258;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar6,t,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          if (local_258 != FATAL_ERROR) goto LAB_004198c5;
          local_29c = 1;
        }
        else {
LAB_004198c5:
          local_29c = 0;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType);
        if (local_29c != 0) goto LAB_00419c5b;
      }
      cmsys::SystemTools::ConvertToUnixSlashes(in_name);
      pVar10 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(uniqueDirectories,in_name);
      local_2c0._M_cur =
           (__node_type *)
           pVar10.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_2b8 = pVar10.second;
      local_2b0._M_cur = local_2c0._M_cur;
      local_2a8 = local_2b8;
      if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     directories,in_name), debugDirectories)) {
        std::operator+(&local_300," * ",in_name);
        std::operator+(&local_2e0,&local_300,"\n");
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
      this = cmLocalGenerator::GetCMakeInstance(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"Used link directories for target ",&local_381);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_360,&local_380,psVar9);
      std::operator+(&local_340,&local_360,":\n");
      std::operator+(&local_320,&local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      (*pTVar1->_vptr_TargetPropertyEntry[4])(&local_398);
      cmake::IssueMessage(this,LOG,&local_320,&local_398);
      cmListFileBacktrace::~cmListFileBacktrace(&local_398);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
    }
    local_29c = 0;
LAB_00419c5b:
    std::__cxx11::string::~string((string *)&__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    if (local_29c != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void processLinkDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& directories,
  std::unordered_set<std::string>& uniqueDirectories,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugDirectories, std::string const& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();

    std::vector<std::string> entryDirectories;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryDirectories);

    std::string usedDirectories;
    for (std::string& entryDirectory : entryDirectories) {
      if (!cmSystemTools::FileIsFullPath(entryDirectory)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_LINK_DIRECTORIES:\n"
            "  \"" << entryDirectory << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0081()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0081) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating link directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryDirectory << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      // Sanitize the path the same way the link_directories command does
      // in case projects set the LINK_DIRECTORIES property directly.
      cmSystemTools::ConvertToUnixSlashes(entryDirectory);
      if (uniqueDirectories.insert(entryDirectory).second) {
        directories.emplace_back(entryDirectory);
        if (debugDirectories) {
          usedDirectories += " * " + entryDirectory + "\n";
        }
      }
    }
    if (!usedDirectories.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used link directories for target ") + tgt->GetName() +
          ":\n" + usedDirectories,
        entry->GetBacktrace());
    }
  }
}